

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInt.h
# Opt level: O3

BigInt * __thiscall BigInt::operator+(BigInt *__return_storage_ptr__,BigInt *this,BigInt *that)

{
  iterator __position;
  bool bVar1;
  pointer plVar2;
  pointer plVar3;
  ulong uVar4;
  pointer plVar5;
  BigInt *res;
  ulong uVar6;
  ulong uVar7;
  longlong lVar8;
  long lVar9;
  ulong uVar10;
  BigInt res_1;
  BigInt local_50;
  
  if (this->sign == that->sign) {
    std::vector<long_long,_std::allocator<long_long>_>::vector
              (&__return_storage_ptr__->vector_value,&that->vector_value);
    __return_storage_ptr__->sign = that->sign;
    plVar2 = (this->vector_value).super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    plVar3 = (this->vector_value).super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    uVar4 = (long)plVar3 - (long)plVar2 >> 3;
    uVar6 = (long)(that->vector_value).super__Vector_base<long_long,_std::allocator<long_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(that->vector_value).super__Vector_base<long_long,_std::allocator<long_long>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 3;
    if (uVar6 < uVar4) {
      uVar6 = uVar4;
    }
    if (0 < (int)uVar6) {
      plVar5 = (__return_storage_ptr__->vector_value).
               super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar4 = 0;
      uVar6 = 0;
      do {
        __position._M_current =
             (__return_storage_ptr__->vector_value).
             super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (uVar4 == ((ulong)((long)__position._M_current - (long)plVar5) >> 3 & 0xffffffff)) {
          local_50.vector_value.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          if (__position._M_current ==
              (__return_storage_ptr__->vector_value).
              super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<long_long,_std::allocator<long_long>_>::_M_realloc_insert<long_long>
                      (&__return_storage_ptr__->vector_value,__position,(longlong *)&local_50);
            plVar2 = (this->vector_value).super__Vector_base<long_long,_std::allocator<long_long>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            plVar3 = (this->vector_value).super__Vector_base<long_long,_std::allocator<long_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
          }
          else {
            *__position._M_current = 0;
            (__return_storage_ptr__->vector_value).
            super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
            super__Vector_impl_data._M_finish = __position._M_current + 1;
          }
        }
        if ((long)uVar4 < (long)(int)((ulong)((long)plVar3 - (long)plVar2) >> 3)) {
          lVar8 = plVar2[uVar4];
        }
        else {
          lVar8 = 0;
        }
        plVar5 = (__return_storage_ptr__->vector_value).
                 super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar9 = lVar8 + uVar6 + plVar5[uVar4];
        plVar5[uVar4] = lVar9;
        lVar8 = base;
        bVar1 = base <= lVar9;
        if (base <= lVar9) {
          plVar5[uVar4] = lVar9 - base;
        }
        uVar6 = (ulong)bVar1;
        uVar4 = uVar4 + 1;
        uVar7 = (long)plVar3 - (long)plVar2 >> 3;
        uVar10 = (long)(that->vector_value).
                       super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(that->vector_value).
                       super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                       super__Vector_impl_data._M_start >> 3;
        if (uVar10 < uVar7) {
          uVar10 = uVar7;
        }
      } while ((lVar8 <= lVar9) || ((int)uVar4 < (int)uVar10));
    }
  }
  else {
    std::vector<long_long,_std::allocator<long_long>_>::vector
              (&local_50.vector_value,&that->vector_value);
    local_50.sign = -that->sign;
    operator-(__return_storage_ptr__,this,&local_50);
    if (local_50.vector_value.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_50.vector_value.
                      super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

BigInt operator+(const BigInt &that) const { //! addition operator overloading
        if (sign == that.sign) {
            BigInt res = that; //! initialize with THAT, even both are negatives this will work

            //! keep looping for all digits until exhausted considering the carry (go from the least significant digit)
            for (int i = 0, carry = 0; i < (int) max(vector_value.size(), that.vector_value.size()) || carry; ++i) {

                if (i == (int) res.vector_value.size())
                    res.vector_value.push_back(0); //! due to carry the result may be n+1

                //! accumulate to this digit
                res.vector_value[i] += carry + (i < (int) vector_value.size() ? vector_value[i] : 0);

                //! make a carry to the next digit if sum can't fit in this digit
                //! same as carry = sum / base
                carry = res.vector_value[i] >= base;

                if (carry)
                    res.vector_value[i] -= base; //!keep only the remainder = sum % base
            }

            return res;
        }

        //! A+B have different signs represent them as difference
        return *this - (-that);
    }